

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_system.cc
# Opt level: O0

void util::fs::read_file_to_string(string *filename,string *data)

{
  byte bVar1;
  char *pcVar2;
  FileException *this;
  int *piVar3;
  long lVar4;
  fpos local_248 [16];
  streamoff local_238;
  size_t length;
  char local_220 [8];
  ifstream in;
  string *data_local;
  string *filename_local;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_220,pcVar2,_S_bin);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    piVar3 = __errno_location();
    pcVar2 = strerror(*piVar3);
    FileException::FileException(this,filename,pcVar2);
    __cxa_throw(this,&FileException::typeinfo,FileException::~FileException);
  }
  std::istream::seekg((long)local_220,_S_beg);
  local_248 = (fpos  [16])std::istream::tellg();
  local_238 = std::fpos::operator_cast_to_long(local_248);
  std::istream::seekg((long)local_220,_S_beg);
  std::__cxx11::string::resize((ulong)data);
  lVar4 = std::__cxx11::string::operator[]((ulong)data);
  std::istream::read(local_220,lVar4);
  std::ifstream::close();
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

void
read_file_to_string (std::string const& filename, std::string* data)
{
    std::ifstream in(filename.c_str(), std::ios::binary);
    if (!in.good())
        throw util::FileException(filename, std::strerror(errno));
    in.seekg(0, std::ios::end);
    std::size_t length = in.tellg();
    in.seekg(0, std::ios::beg);
    data->resize(length);
    in.read(&(*data)[0], length);
    in.close();
}